

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

int map_set_(map_base_t *m,char *key,void *value,int vsize)

{
  map_node_t *pmVar1;
  map_node_t *pmVar2;
  uint uVar3;
  map_node_t **ppmVar4;
  size_t sVar5;
  map_node_t *__ptr;
  char cVar6;
  uint uVar7;
  map_node_t **ppmVar8;
  char *pcVar9;
  ulong uVar10;
  long lVar11;
  void *__dest;
  map_node_t *pmVar12;
  
  ppmVar4 = map_getref(m,key);
  if (ppmVar4 == (map_node_t **)0x0) {
    sVar5 = strlen(key);
    uVar3 = (uint)sVar5;
    lVar11 = (long)(int)((~uVar3 & 7) + uVar3 + 1);
    __ptr = (map_node_t *)malloc(lVar11 + 0x18 + (long)vsize);
    if (__ptr == (map_node_t *)0x0) {
      return -1;
    }
    memcpy(__ptr + 1,key,(long)(int)(uVar3 + 1));
    cVar6 = *key;
    if (cVar6 == '\0') {
      uVar3 = 0x1505;
    }
    else {
      pcVar9 = key + 1;
      uVar3 = 0x1505;
      do {
        uVar3 = (int)cVar6 ^ uVar3 * 0x21;
        cVar6 = *pcVar9;
        pcVar9 = pcVar9 + 1;
      } while (cVar6 != '\0');
    }
    __ptr->hash = uVar3;
    __dest = (void *)((long)&__ptr[1].hash + lVar11);
    __ptr->value = __dest;
    memcpy(__dest,value,(long)vsize);
    uVar3 = m->nbuckets;
    uVar7 = m->nnodes;
    if (uVar3 <= uVar7) {
      ppmVar4 = m->buckets;
      uVar10 = 1;
      if (uVar3 == 0) {
        pmVar12 = (map_node_t *)0x0;
      }
      else {
        uVar10 = (ulong)(uVar3 * 2);
        lVar11 = (long)(int)uVar3;
        pmVar12 = (map_node_t *)0x0;
        do {
          pmVar1 = ppmVar4[lVar11 + -1];
          while (pmVar2 = pmVar1, pmVar2 != (map_node_t *)0x0) {
            pmVar1 = pmVar2->next;
            pmVar2->next = pmVar12;
            pmVar12 = pmVar2;
          }
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      ppmVar4 = (map_node_t **)realloc(ppmVar4,(long)(int)(uint)uVar10 << 3);
      if (ppmVar4 == (map_node_t **)0x0) {
        ppmVar8 = m->buckets;
        if (ppmVar8 == (map_node_t **)0x0) goto LAB_001018d3;
        uVar10 = (ulong)m->nbuckets;
      }
      else {
        m->buckets = ppmVar4;
        m->nbuckets = (uint)uVar10;
        ppmVar8 = ppmVar4;
      }
      memset(ppmVar8,0,uVar10 << 3);
      if (pmVar12 != (map_node_t *)0x0) {
        uVar3 = m->nbuckets;
        do {
          pmVar1 = pmVar12->next;
          ppmVar8 = m->buckets;
          uVar7 = pmVar12->hash & uVar3 - 1;
          pmVar12->next = ppmVar8[(int)uVar7];
          ppmVar8[(int)uVar7] = pmVar12;
          pmVar12 = pmVar1;
        } while (pmVar1 != (map_node_t *)0x0);
      }
      if (ppmVar4 == (map_node_t **)0x0) {
LAB_001018d3:
        free(__ptr);
        return -1;
      }
      uVar3 = m->nbuckets;
      uVar7 = m->nnodes;
    }
    uVar3 = uVar3 - 1 & __ptr->hash;
    ppmVar4 = m->buckets;
    __ptr->next = ppmVar4[(int)uVar3];
    ppmVar4[(int)uVar3] = __ptr;
    m->nnodes = uVar7 + 1;
  }
  else {
    memcpy((*ppmVar4)->value,value,(long)vsize);
  }
  return 0;
}

Assistant:

int map_set_(map_base_t *m, const char *key, void *value, int vsize) {
  int n, err;
  map_node_t **next, *node;
  /* Find & replace existing node */
  next = map_getref(m, key);
  if (next) {
    memcpy((*next)->value, value, vsize);
    return 0;
  }
  /* Add new node */
  node = map_newnode(key, value, vsize);
  if (node == NULL) goto fail;
  if (m->nnodes >= m->nbuckets) {
    n = (m->nbuckets > 0) ? (m->nbuckets << 1) : 1;
    err = map_resize(m, n);
    if (err) goto fail;
  }
  map_addnode(m, node);
  m->nnodes++;
  return 0;
  fail:
  if (node) free(node);
  return -1;
}